

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

Aig_Man_t * Aig_ManCreateDualOutputMiter(Aig_Man_t *p1,Aig_Man_t *p2)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p2_local;
  Aig_Man_t *p1_local;
  
  iVar1 = Aig_ManCiNum(p1);
  iVar2 = Aig_ManCiNum(p2);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(p1) == Aig_ManCiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress2.c"
                  ,0x57,"Aig_Man_t *Aig_ManCreateDualOutputMiter(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar1 = Aig_ManCoNum(p1);
  iVar2 = Aig_ManCoNum(p2);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCoNum(p1) == Aig_ManCoNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress2.c"
                  ,0x58,"Aig_Man_t *Aig_ManCreateDualOutputMiter(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar1 = Aig_ManObjNumMax(p1);
  iVar2 = Aig_ManObjNumMax(p2);
  p = Aig_ManStart(iVar1 + iVar2);
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(p1);
  (pAVar4->field_5).pData = pAVar3;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p1->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar5 = Vec_PtrEntry(p1->vCis,local_2c);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p1->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,local_2c);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar6 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p,pAVar4,pAVar6);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(p2);
  (pAVar4->field_5).pData = pAVar3;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p2->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar5 = Vec_PtrEntry(p2->vCis,local_2c);
    pAVar3 = Aig_ManCi(p,local_2c);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p2->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p2->vObjs,local_2c);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar6 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p,pAVar4,pAVar6);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (local_2c = 0; iVar1 = Aig_ManCoNum(p1), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Aig_ManCo(p1,local_2c);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p,pAVar3);
    pAVar3 = Aig_ManCo(p2,local_2c);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p,pAVar3);
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Aig_ManCreateDualOutputMiter( Aig_Man_t * p1, Aig_Man_t * p2 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p1) == Aig_ManCiNum(p2) );
    assert( Aig_ManCoNum(p1) == Aig_ManCoNum(p2) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p1) + Aig_ManObjNumMax(p2) );
    // add first AIG
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add second AIG
    Aig_ManConst1(p2)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p2, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    Aig_ManForEachNode( p2, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the outputs
    for ( i = 0; i < Aig_ManCoNum(p1); i++ )
    {
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1, i)) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(Aig_ManCo(p2, i)) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}